

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O0

void __thiscall
Jinx::
Allocator<std::_Sp_counted_ptr_inplace<Jinx::Impl::Runtime,_Jinx::Allocator<Jinx::Impl::Runtime>,_(__gnu_cxx::_Lock_policy)2>_>
::deallocate(Allocator<std::_Sp_counted_ptr_inplace<Jinx::Impl::Runtime,_Jinx::Allocator<Jinx::Impl::Runtime>,_(__gnu_cxx::_Lock_policy)2>_>
             *this,void *ptr,size_t n)

{
  size_t n_local;
  void *ptr_local;
  Allocator<std::_Sp_counted_ptr_inplace<Jinx::Impl::Runtime,_Jinx::Allocator<Jinx::Impl::Runtime>,_(__gnu_cxx::_Lock_policy)2>_>
  *this_local;
  
  MemFree(ptr,n * 0x1200);
  return;
}

Assistant:

void deallocate(void* ptr, size_t n) { Jinx::MemFree(static_cast<T*> (ptr), n * sizeof(value_type)); }